

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526Storage.hpp
# Opt level: O0

bool __thiscall MOS::MOS6526::TODStorage<true>::advance(TODStorage<true> *this,int count)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t increment;
  uint32_t distance_to_alarm;
  int count_local;
  TODStorage<true> *this_local;
  
  uVar1 = this->value_;
  uVar2 = count & this->increment_mask_;
  this->value_ = this->value_ + uVar2 & 0xffffff;
  return (this->alarm_ - uVar1 & 0xffffff) <= uVar2;
}

Assistant:

bool advance(int count) {
			// The 8250 uses a simple binary counter to replace the
			// 6526's time-of-day clock. So this is easy.
			const uint32_t distance_to_alarm = (alarm_ - value_) & 0xff'ffff;
			const auto increment = uint32_t(count) & increment_mask_;
			value_ = (value_ + increment) & 0xff'ffff;
			return distance_to_alarm <= increment;
		}